

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm_x86::forward_int8
          (Gemm_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  int iVar2;
  pointer pMVar3;
  Mat *this_00;
  Mat *A;
  void *pvVar4;
  float max_jj;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  float fVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  float fVar30;
  int *piVar31;
  bool bVar32;
  uint local_34c;
  float B_int8_scale;
  int TILE_K;
  Mat *local_338;
  Mat local_328;
  ulong local_2e0;
  Mat m_1;
  Mat m_3;
  Mat local_228;
  Mat m;
  Mat local_188;
  ulong local_140;
  Mat m_2;
  int TILE_K_2;
  ulong local_d0;
  int TILE_M;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  float B_int8_scale_1;
  int local_7c;
  int TILE_N;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  int local_60;
  Allocator *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  int local_40;
  size_t local_38;
  
  iVar26 = (this->super_Gemm).constantA;
  iVar2 = (this->super_Gemm).constantB;
  if (iVar2 != 0 && iVar26 != 0) {
    uVar22 = (this->super_Gemm).constantM;
LAB_004b9c50:
    uVar28 = (this->super_Gemm).constantN;
  }
  else {
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar26 == 0) {
      iVar13 = (this->super_Gemm).transA;
      if (iVar2 != 0) {
        if (iVar13 == 0) {
          uVar22 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
        }
        else {
          uVar22 = pMVar3->w;
        }
        goto LAB_004b9c50;
      }
      if (iVar13 == 0) {
        uVar22 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
      }
      else {
        uVar22 = pMVar3->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar28 = pMVar3[1].w;
      }
      else {
        uVar28 = pMVar3[1].elempack * (&pMVar3[1].h)[(ulong)(pMVar3[1].dims == 3) * 2];
      }
    }
    else {
      uVar22 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar28 = pMVar3->w;
      }
      else {
        uVar28 = pMVar3->elempack * (&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2];
      }
    }
  }
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.allocator = (Allocator *)0x0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar3;
    if (iVar2 != 0 && iVar26 != 0) {
      if (lVar24 == 0x48) {
        local_328.data = pMVar3->data;
        piVar31 = pMVar3->refcount;
        sVar17 = pMVar3->elemsize;
        local_328.elempack = pMVar3->elempack;
        local_328.allocator = pMVar3->allocator;
        local_328.dims = pMVar3->dims;
        local_328.w = pMVar3->w;
        local_328.h = pMVar3->h;
        local_328.d = pMVar3->d;
        local_328.c = pMVar3->c;
        local_328.cstep = pMVar3->cstep;
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + 1;
          UNLOCK();
        }
      }
      else {
        local_328.dims = 0;
        local_328.w = 0;
        local_328.h = 0;
        local_328.d = 0;
        local_328.allocator = (Allocator *)0x0;
        local_328.elempack = 0;
        sVar17 = 0;
        piVar31 = (int *)0x0;
        local_328.data = (void *)0x0;
        local_328.c = 0;
        local_328.cstep = 0;
      }
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + 1;
        UNLOCK();
      }
      local_328.refcount._0_4_ = SUB84(piVar31,0);
      local_328.refcount._4_4_ = (undefined4)((ulong)piVar31 >> 0x20);
      local_328.elemsize._0_4_ = (undefined4)sVar17;
      local_328.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + -1;
        UNLOCK();
        if (*piVar31 == 0) {
          if (local_328.allocator == (Allocator *)0x0) goto LAB_004bcc91;
          (*(local_328.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else if (iVar26 == 0) {
      if (iVar2 == 0) {
        if (lVar24 == 0xd8) {
          local_328.data = pMVar3[2].data;
          piVar31 = pMVar3[2].refcount;
          sVar17 = pMVar3[2].elemsize;
          local_328.elempack = pMVar3[2].elempack;
          local_328.allocator = pMVar3[2].allocator;
          local_328.dims = pMVar3[2].dims;
          local_328.w = pMVar3[2].w;
          local_328.h = pMVar3[2].h;
          local_328.d = pMVar3[2].d;
          local_328.c = pMVar3[2].c;
          local_328.cstep = pMVar3[2].cstep;
          if (piVar31 != (int *)0x0) {
            LOCK();
            *piVar31 = *piVar31 + 1;
            UNLOCK();
          }
        }
        else {
          local_328.dims = 0;
          local_328.w = 0;
          local_328.h = 0;
          local_328.d = 0;
          local_328.cstep = 0;
          local_328.c = 0;
          local_328.allocator = (Allocator *)0x0;
          local_328.elempack = 0;
          sVar17 = 0;
          piVar31 = (int *)0x0;
          local_328.data = (void *)0x0;
        }
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + 1;
          UNLOCK();
        }
        local_328.refcount._0_4_ = SUB84(piVar31,0);
        local_328.refcount._4_4_ = (undefined4)((ulong)piVar31 >> 0x20);
        local_328.elemsize._0_4_ = (undefined4)sVar17;
        local_328.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + -1;
          UNLOCK();
          if (*piVar31 == 0) {
            if (local_328.allocator == (Allocator *)0x0) goto LAB_004bcc91;
            (*(local_328.allocator)->_vptr_Allocator[3])(local_328.allocator);
          }
        }
      }
      else {
        if (lVar24 == 0x90) {
          local_328.data = pMVar3[1].data;
          piVar31 = pMVar3[1].refcount;
          sVar17 = pMVar3[1].elemsize;
          local_328.elempack = pMVar3[1].elempack;
          local_328.allocator = pMVar3[1].allocator;
          local_328.dims = pMVar3[1].dims;
          local_328.w = pMVar3[1].w;
          local_328.h = pMVar3[1].h;
          local_328.d = pMVar3[1].d;
          local_328.c = pMVar3[1].c;
          local_328.cstep = pMVar3[1].cstep;
          if (piVar31 != (int *)0x0) {
            LOCK();
            *piVar31 = *piVar31 + 1;
            UNLOCK();
          }
        }
        else {
          local_328.dims = 0;
          local_328.w = 0;
          local_328.h = 0;
          local_328.d = 0;
          local_328.cstep = 0;
          local_328.c = 0;
          local_328.allocator = (Allocator *)0x0;
          local_328.elempack = 0;
          sVar17 = 0;
          piVar31 = (int *)0x0;
          local_328.data = (void *)0x0;
        }
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + 1;
          UNLOCK();
        }
        local_328.refcount._0_4_ = SUB84(piVar31,0);
        local_328.refcount._4_4_ = (undefined4)((ulong)piVar31 >> 0x20);
        local_328.elemsize._0_4_ = (undefined4)sVar17;
        local_328.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + -1;
          UNLOCK();
          if (*piVar31 == 0) {
            if (local_328.allocator == (Allocator *)0x0) {
LAB_004bcc91:
              if (local_328.data != (void *)0x0) {
                free(local_328.data);
              }
            }
            else {
              (*(local_328.allocator)->_vptr_Allocator[3])(local_328.allocator);
            }
          }
        }
      }
    }
    else {
      if (lVar24 == 0x90) {
        local_328.data = pMVar3[1].data;
        piVar31 = pMVar3[1].refcount;
        sVar17 = pMVar3[1].elemsize;
        local_328.elempack = pMVar3[1].elempack;
        local_328.allocator = pMVar3[1].allocator;
        local_328.dims = pMVar3[1].dims;
        local_328.w = pMVar3[1].w;
        local_328.h = pMVar3[1].h;
        local_328.d = pMVar3[1].d;
        local_328.c = pMVar3[1].c;
        local_328.cstep = pMVar3[1].cstep;
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + 1;
          UNLOCK();
        }
      }
      else {
        local_328.dims = 0;
        local_328.w = 0;
        local_328.h = 0;
        local_328.d = 0;
        local_328.cstep = 0;
        local_328.c = 0;
        local_328.allocator = (Allocator *)0x0;
        local_328.elempack = 0;
        sVar17 = 0;
        piVar31 = (int *)0x0;
        local_328.data = (void *)0x0;
      }
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + 1;
        UNLOCK();
      }
      local_328.refcount._0_4_ = SUB84(piVar31,0);
      local_328.refcount._4_4_ = (undefined4)((ulong)piVar31 >> 0x20);
      local_328.elemsize._0_4_ = (undefined4)sVar17;
      local_328.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + -1;
        UNLOCK();
        if (*piVar31 == 0) {
          if (local_328.allocator == (Allocator *)0x0) goto LAB_004bcc91;
          (*(local_328.allocator)->_vptr_Allocator[3])(local_328.allocator);
        }
      }
    }
    local_34c = 0;
    if ((local_328.data != (void *)0x0) && ((long)local_328.c * local_328.cstep != 0)) {
      uVar14 = 4;
      if (local_328.elempack * local_328.w != uVar28) {
        uVar14 = (uint)(local_328.elempack * local_328.w == uVar22 && local_328.dims == 1);
      }
      local_34c = 0;
      if (local_328.dims == 1) {
        local_34c = uVar14;
      }
      uVar14 = local_328.dims ^ 2;
      if ((local_328.w == 1 && uVar14 == 0) && (local_328.elempack * local_328.h == uVar22)) {
        local_34c = 2;
      }
      if ((uVar14 == 0 && local_328.w == uVar28) && (local_328.elempack * local_328.h == uVar22)) {
        local_34c = 3;
      }
      if ((uVar14 == 0 && local_328.w == uVar28) && (local_328.elempack * local_328.h == 1)) {
        local_34c = 4;
      }
    }
  }
  else {
    if (&local_328 != &this->CT_data) {
      piVar31 = (this->CT_data).refcount;
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + 1;
        UNLOCK();
      }
      local_328.data = (this->CT_data).data;
      piVar31 = (this->CT_data).refcount;
      local_328.refcount._0_4_ = SUB84(piVar31,0);
      local_328.refcount._4_4_ = (undefined4)((ulong)piVar31 >> 0x20);
      sVar17 = (this->CT_data).elemsize;
      local_328.elemsize._0_4_ = (undefined4)sVar17;
      local_328.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
      local_328.elempack = (this->CT_data).elempack;
      local_328.allocator = (this->CT_data).allocator;
      uVar6 = (this->CT_data).dims;
      uVar7 = (this->CT_data).w;
      uVar8 = (this->CT_data).h;
      uVar9 = (this->CT_data).d;
      local_328.c = (this->CT_data).c;
      local_328.cstep = (this->CT_data).cstep;
      local_328.dims = uVar6;
      local_328.w = uVar7;
      local_328.h = uVar8;
      local_328.d = uVar9;
    }
    local_34c = (this->super_Gemm).constant_broadcast_type_C;
  }
  iVar26 = 1;
  if (opt->use_packing_layout == true) {
    uVar14 = uVar28;
    if ((this->super_Gemm).output_transpose == 0) {
      uVar14 = uVar22;
    }
    iVar26 = (uint)((uVar14 & 3) == 0) * 3 + 1;
  }
  iVar2 = (this->super_Gemm).output_elempack;
  if (iVar2 != 0) {
    iVar26 = iVar2;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar14 = uVar28;
  if ((this->super_Gemm).output_transpose != 0) {
    uVar14 = uVar22;
    uVar22 = uVar28;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(this_00,uVar14,(int)uVar22 / iVar26,(ulong)(uint)(iVar26 * 4),iVar26,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar14,1,(int)uVar22 / iVar26,(ulong)(uint)(iVar26 * 4),iVar26,
                opt->blob_allocator);
  }
  iVar26 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_004bd28b;
  uVar22 = *(uint *)&(this->super_Gemm).field_0x244;
  uVar28 = uVar22;
  if (uVar22 == 0) {
    uVar28 = opt->num_threads;
  }
  if (opt->num_threads != uVar22 && uVar22 != 0) {
    forward_int8();
  }
  iVar26 = (this->super_Gemm).constantA;
  iVar2 = (this->super_Gemm).constantB;
  if (iVar2 == 0 || iVar26 == 0) {
    A = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
    if (iVar26 != 0) {
      uVar22 = (this->super_Gemm).constantM;
      iVar2 = (this->super_Gemm).constantK;
      iVar13 = (this->super_Gemm).transB;
      if (iVar13 == 0) {
        iVar21 = A->w;
      }
      else {
        iVar21 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
      }
      local_140 = (ulong)(uint)(this->super_Gemm).output_transpose;
      fVar1 = (this->super_Gemm).alpha;
      fVar23 = (this->super_Gemm).beta;
      local_2e0 = (ulong)uVar28;
      get_optimal_tile_mnk_int8
                (uVar22,iVar21,iVar2,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,uVar28);
      local_d0 = CONCAT44(local_d0._4_4_,(int)(uVar22 + TILE_M + -1) / TILE_M);
      iVar27 = (TILE_N + iVar21 + -1) / TILE_N;
      iVar26 = (iVar2 + TILE_K + -1) / TILE_K;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      local_338 = (Mat *)CONCAT44(local_338._4_4_,iVar26);
      Mat::create(&local_188,TILE_K * TILE_N,iVar26,iVar27,1,opt->workspace_allocator);
      iVar26 = -100;
      if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
        compute_B_int8_scale(A,&B_int8_scale);
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.allocator = (Allocator *)0x0;
        local_228.dims = 0;
        local_228.w = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
        Mat::create(&local_228,uVar22,4,opt->workspace_allocator);
        iVar15 = TILE_K;
        iVar26 = -100;
        if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
          iVar27 = iVar27 * (int)local_338._0_4_;
          if (0 < (int)uVar22) {
            pvVar4 = (this->super_Gemm).A_data_int8_scales.data;
            uVar19 = 0;
            do {
              *(float *)((long)local_228.data + uVar19 * 4) =
                   1.0 / (*(float *)((long)pvVar4 + uVar19 * 4) * B_int8_scale);
              uVar19 = uVar19 + 1;
            } while (uVar22 != uVar19);
          }
          if (0 < iVar27) {
            iVar26 = TILE_N;
            iVar29 = 0;
            do {
              iVar16 = iVar26 * (iVar29 / (int)local_338._0_4_);
              iVar25 = iVar15 * (int)((long)iVar29 % (long)(int)local_338._0_4_);
              iVar12 = iVar21 - iVar16;
              if (iVar26 < iVar21 - iVar16) {
                iVar12 = iVar26;
              }
              iVar10 = iVar2 - iVar25;
              if (iVar15 < iVar2 - iVar25) {
                iVar10 = iVar15;
              }
              m_3.cstep = (size_t)local_188.w;
              m_3.data = (void *)((long)local_188.data +
                                 ((long)iVar29 % (long)(int)local_338._0_4_ & 0xffffffffU) *
                                 m_3.cstep *
                                 CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize) +
                                 (long)(iVar29 / (int)local_338._0_4_) * local_188.cstep *
                                 CONCAT44(local_188.elemsize._4_4_,(undefined4)local_188.elemsize));
              m_3.refcount._0_4_ = 0;
              m_3.refcount._4_4_ = 0;
              m_3.elemsize._0_4_ = (undefined4)local_188.elemsize;
              m_3.elemsize._4_4_ = local_188.elemsize._4_4_;
              m_3.elempack = local_188.elempack;
              m_3.allocator = local_188.allocator;
              m_3.dims = 2;
              m_3.w = local_188.w;
              m_3.h = 1;
              m_3.d = 1;
              m_3.c = 1;
              if (iVar13 == 0) {
                transpose_pack_B_tile_quantize(A,&m_3,iVar16,iVar12,iVar25,iVar10,B_int8_scale);
              }
              else {
                pack_B_tile_quantize(A,&m_3,iVar16,iVar12,iVar25,iVar10,B_int8_scale);
              }
              iVar29 = iVar29 + 1;
            } while (iVar27 != iVar29);
          }
          iVar27 = TILE_N;
          iVar13 = TILE_M;
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          Mat::create(&m_3,TILE_M * TILE_N,1,(int)local_2e0,4,opt->workspace_allocator);
          iVar26 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            if ((int)local_d0 < 1) {
              iVar26 = 0;
            }
            else {
              local_2e0 = local_d0 & 0xffffffff;
              uVar19 = 0;
              do {
                iVar15 = iVar13 * (int)uVar19;
                iVar26 = uVar22 - iVar15;
                if (iVar13 < (int)(uVar22 - iVar15)) {
                  iVar26 = iVar13;
                }
                iVar29 = get_omp_thread_num();
                uVar20 = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                m.data = (void *)((long)iVar29 * m_3.cstep * uVar20 + (long)m_3.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)m_3.elemsize;
                m.elemsize._4_4_ = m_3.elemsize._4_4_;
                m.elempack = m_3.elempack;
                m.allocator = m_3.allocator;
                m.w = m_3.w;
                m.h = m_3.h;
                m.d = 1;
                m.c = m_3.d;
                m.dims = m_3.dims + -1;
                m.cstep = (uVar20 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar20;
                if (m_3.dims == 4) {
                  m.cstep = (long)m_3.h * (long)m_3.w;
                }
                if (0 < iVar21) {
                  iVar29 = 0;
                  do {
                    iVar12 = iVar21 - iVar29;
                    if (iVar27 < iVar21 - iVar29) {
                      iVar12 = iVar27;
                    }
                    if (0 < iVar2) {
                      local_338 = (Mat *)(long)(iVar29 / iVar27);
                      iVar25 = 0;
                      iVar16 = iVar2;
                      do {
                        iVar10 = iVar16;
                        if (TILE_K < iVar16) {
                          iVar10 = TILE_K;
                        }
                        m_1.w = (this->AT_data).w;
                        m_1.cstep = (size_t)m_1.w;
                        sVar17 = (this->AT_data).elemsize;
                        m_1.elempack = (this->AT_data).elempack;
                        m_1.allocator = (this->AT_data).allocator;
                        m_1.data = (void *)((long)(this->AT_data).data +
                                           sVar17 * m_1.cstep * (long)(iVar25 / TILE_K) +
                                           (this->AT_data).cstep * uVar19 * sVar17);
                        m_1.refcount._0_4_ = 0;
                        m_1.refcount._4_4_ = 0;
                        m_1.elemsize._0_4_ = (undefined4)sVar17;
                        m_1.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
                        m_1.dims = 2;
                        m_1.h = 1;
                        m_1.d = 1;
                        m_1.c = 1;
                        m_2.cstep = (size_t)local_188.w;
                        m_2.data = (void *)((long)local_188.data +
                                           m_2.cstep *
                                           CONCAT44(local_188.elemsize._4_4_,
                                                    (undefined4)local_188.elemsize) *
                                           (long)(iVar25 / TILE_K) +
                                           local_188.cstep * (long)local_338 *
                                           CONCAT44(local_188.elemsize._4_4_,
                                                    (undefined4)local_188.elemsize));
                        m_2.refcount._0_4_ = 0;
                        m_2.refcount._4_4_ = 0;
                        m_2.elemsize._0_4_ = (undefined4)local_188.elemsize;
                        m_2.elemsize._4_4_ = local_188.elemsize._4_4_;
                        m_2.elempack = local_188.elempack;
                        m_2.allocator = local_188.allocator;
                        m_2.w = local_188.w;
                        m_2.dims = 2;
                        m_2.h = 1;
                        m_2.d = 1;
                        m_2.c = 1;
                        gemm_transB_packed_tile_int8
                                  (&m_1,&m_2,&m,iVar15,iVar26,iVar29,iVar12,iVar25,iVar10);
                        piVar31 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                        if (piVar31 != (int *)0x0) {
                          LOCK();
                          *piVar31 = *piVar31 + -1;
                          UNLOCK();
                          if (*piVar31 == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        m_2.cstep = 0;
                        m_2.data = (void *)0x0;
                        m_2.refcount._0_4_ = 0;
                        m_2.refcount._4_4_ = 0;
                        m_2.elemsize._0_4_ = 0;
                        m_2.elemsize._4_4_ = 0;
                        m_2.elempack = 0;
                        m_2.dims = 0;
                        m_2.w = 0;
                        m_2.h = 0;
                        m_2.d = 0;
                        m_2.c = 0;
                        piVar31 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                        if (piVar31 != (int *)0x0) {
                          LOCK();
                          *piVar31 = *piVar31 + -1;
                          UNLOCK();
                          if (*piVar31 == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              if (m_1.data != (void *)0x0) {
                                free(m_1.data);
                              }
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        m_1.cstep = 0;
                        m_1.data = (void *)0x0;
                        m_1.refcount._0_4_ = 0;
                        m_1.refcount._4_4_ = 0;
                        m_1.elemsize._0_4_ = 0;
                        m_1.elemsize._4_4_ = 0;
                        m_1.elempack = 0;
                        m_1.dims = 0;
                        m_1.w = 0;
                        m_1.h = 0;
                        m_1.d = 0;
                        m_1.c = 0;
                        iVar25 = iVar25 + TILE_K;
                        iVar16 = iVar16 - TILE_K;
                      } while (iVar25 < iVar2);
                    }
                    unpack_output_tile_dequantize
                              (&m,&local_328,this_00,local_34c,iVar15,iVar26,iVar29,iVar12,
                               &local_228,fVar1,fVar23,(int)local_140);
                    iVar29 = iVar29 + iVar27;
                  } while (iVar29 < iVar21);
                }
                piVar31 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                if (piVar31 != (int *)0x0) {
                  LOCK();
                  *piVar31 = *piVar31 + -1;
                  UNLOCK();
                  if (*piVar31 == 0) {
                    if (m.allocator == (Allocator *)0x0) {
                      if (m.data != (void *)0x0) {
                        free(m.data);
                      }
                    }
                    else {
                      (*(m.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                m.cstep = 0;
                m.data = (void *)0x0;
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = 0;
                m.elemsize._4_4_ = 0;
                m.elempack = 0;
                m.dims = 0;
                m.w = 0;
                m.h = 0;
                m.d = 0;
                m.c = 0;
                uVar19 = uVar19 + 1;
              } while (uVar19 != local_2e0);
              iVar26 = 0;
            }
          }
          piVar31 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar31 != (int *)0x0) {
            LOCK();
            *piVar31 = *piVar31 + -1;
            UNLOCK();
            if (*piVar31 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
        }
        piVar31 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + -1;
          UNLOCK();
          if (*piVar31 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.dims = 0;
        local_228.w = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
      }
      piVar31 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + -1;
        UNLOCK();
        if (*piVar31 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      goto LAB_004bd28b;
    }
    if (iVar2 != 0) {
      iVar2 = (this->super_Gemm).constantN;
      iVar13 = (this->super_Gemm).constantK;
      iVar21 = (this->super_Gemm).transA;
      if (iVar21 == 0) {
        iVar27 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
      }
      else {
        iVar27 = A->w;
      }
      local_140 = CONCAT44(local_140._4_4_,(this->super_Gemm).B_data_int8_scale);
      iVar15 = (this->super_Gemm).output_transpose;
      fVar1 = (this->super_Gemm).alpha;
      local_2e0 = CONCAT44(local_2e0._4_4_,(this->super_Gemm).beta);
      get_optimal_tile_mnk_int8
                (iVar27,iVar2,iVar13,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_N,
                 &TILE_K,(int *)&B_int8_scale,uVar28);
      iVar29 = TILE_N;
      local_d0 = CONCAT44(local_d0._4_4_,(iVar27 + TILE_N + -1) / TILE_N);
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,iVar27,4,opt->workspace_allocator);
      iVar26 = -100;
      if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.allocator = (Allocator *)0x0;
        local_228.dims = 0;
        local_228.w = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
        Mat::create(&local_228,iVar27,4,opt->workspace_allocator);
        iVar26 = -100;
        if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          if ((int)B_int8_scale < 4) {
LAB_004bc3ea:
            Mat::create(&m_3,(int)B_int8_scale * iVar29,
                        (iVar13 + (int)B_int8_scale + -1) / (int)B_int8_scale,uVar28,1,
                        opt->workspace_allocator);
          }
          else {
            iVar26 = cpu_support_x86_avx512_vnni();
            bVar32 = true;
            if (iVar26 == 0) {
              iVar26 = cpu_support_x86_avx_vnni();
              bVar32 = iVar26 != 0;
            }
            iVar26 = cpu_support_x86_avx_vnni_int8();
            if (!(bool)(bVar32 & iVar26 == 0)) goto LAB_004bc3ea;
            iVar26 = 0x40;
            if (((iVar29 < 0x10) && (iVar26 = 0x20, iVar29 < 8)) && (iVar26 = 0x10, iVar29 < 4)) {
              iVar26 = (uint)(1 < iVar29) * 4 + 4;
            }
            Mat::create(&m_3,(iVar26 + (int)B_int8_scale) * iVar29,
                        (iVar13 + (int)B_int8_scale + -1) / (int)B_int8_scale,uVar28,1,
                        opt->workspace_allocator);
          }
          iVar26 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            m.cstep = 0;
            m.data = (void *)0x0;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = 0;
            m.elemsize._4_4_ = 0;
            m.elempack = 0;
            m.allocator = (Allocator *)0x0;
            m.dims = 0;
            m.w = 0;
            m.h = 0;
            m.d = 0;
            m.c = 0;
            Mat::create(&m,TILE_K * iVar29,1,uVar28,4,opt->workspace_allocator);
            iVar26 = -100;
            if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
              if (0 < (int)local_d0) {
                iVar26 = 0;
                do {
                  if (iVar21 == 0) {
                    iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    fVar23 = (float)A->w;
                  }
                  else {
                    iVar13 = A->w;
                    fVar23 = (float)(A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2]);
                  }
                  iVar12 = iVar26 * iVar29;
                  iVar27 = iVar13 - iVar12;
                  if (iVar29 < iVar13 - iVar12) {
                    iVar27 = iVar29;
                  }
                  iVar13 = get_omp_thread_num();
                  uVar19 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  m_1.data = (void *)((long)iVar13 * m.cstep * uVar19 + (long)m.data);
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.w = m.w;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = m.d;
                  m_1.dims = m.dims + -1;
                  m_1.cstep = (uVar19 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar19;
                  if (m.dims == 4) {
                    m_1.cstep = (long)m.h * (long)m.w;
                  }
                  local_7c = iVar26;
                  if (0 < iVar2) {
                    iVar26 = 0;
                    do {
                      uVar22 = iVar2 - iVar26;
                      if (TILE_K < iVar2 - iVar26) {
                        uVar22 = TILE_K;
                      }
                      local_338 = (Mat *)(ulong)uVar22;
                      if (0 < (int)fVar23) {
                        iVar13 = 0;
                        fVar30 = fVar23;
                        do {
                          fVar5 = fVar30;
                          if ((int)B_int8_scale < (int)fVar30) {
                            fVar5 = B_int8_scale;
                          }
                          iVar16 = get_omp_thread_num();
                          m_2.cstep = (size_t)m_3.w;
                          m_2.data = (void *)((long)m_3.data +
                                             CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize) *
                                             m_2.cstep * (long)(iVar13 / (int)B_int8_scale) +
                                             (long)iVar16 * m_3.cstep *
                                             CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize));
                          m_2.refcount._0_4_ = 0;
                          m_2.refcount._4_4_ = 0;
                          m_2.elemsize._0_4_ = (undefined4)m_3.elemsize;
                          m_2.elemsize._4_4_ = m_3.elemsize._4_4_;
                          m_2.elempack = m_3.elempack;
                          m_2.allocator = m_3.allocator;
                          m_2.w = m_3.w;
                          m_2.dims = 2;
                          m_2.h = 1;
                          m_2.d = 1;
                          m_2.c = 1;
                          local_a0._4_4_ = (this->BT_data).w;
                          local_88 = (size_t)local_a0._4_4_;
                          sVar17 = (this->BT_data).elemsize;
                          _TILE_M = (void *)((long)(this->BT_data).data +
                                            local_88 * sVar17 * (long)(iVar13 / (int)B_int8_scale) +
                                            (long)(iVar26 / TILE_K) * (this->BT_data).cstep * sVar17
                                            );
                          local_b0 = (this->BT_data).elempack;
                          local_a8 = (this->BT_data).allocator;
                          uStack_c0 = 0;
                          uStack_bc = 0;
                          local_b8 = (undefined4)sVar17;
                          uStack_b4 = (undefined4)(sVar17 >> 0x20);
                          local_a0._0_4_ = 2;
                          uStack_98._0_4_ = 1;
                          uStack_98._4_4_ = 1;
                          local_90 = 1;
                          if (iVar26 == 0) {
                            if (iVar13 == 0) {
                              if (iVar21 == 0) {
                                compute_A_tile_int8_scales
                                          (A,&local_188,(float)local_140,&local_228,iVar12,iVar27);
                              }
                              else {
                                transpose_compute_A_tile_int8_scales
                                          (A,&local_188,(float)local_140,&local_228,iVar12,iVar27);
                              }
                            }
                            if (iVar21 == 0) {
                              pack_A_tile_quantize
                                        (A,&m_2,iVar12,iVar27,iVar13,(int)fVar5,&local_188);
                            }
                            else {
                              transpose_pack_A_tile_quantize
                                        (A,&m_2,iVar12,iVar27,iVar13,(int)fVar5,&local_188);
                            }
                          }
                          gemm_transB_packed_tile_int8
                                    (&m_2,(Mat *)&TILE_M,&m_1,iVar12,iVar27,iVar26,(int)local_338,
                                     iVar13,(int)fVar5);
                          piVar31 = (int *)CONCAT44(uStack_bc,uStack_c0);
                          if (piVar31 != (int *)0x0) {
                            LOCK();
                            *piVar31 = *piVar31 + -1;
                            UNLOCK();
                            if (*piVar31 == 0) {
                              if (local_a8 == (Allocator *)0x0) {
                                if (_TILE_M != (void *)0x0) {
                                  free(_TILE_M);
                                }
                              }
                              else {
                                (*local_a8->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_88 = 0;
                          _TILE_M = (void *)0x0;
                          uStack_c0 = 0;
                          uStack_bc = 0;
                          local_b8 = 0;
                          uStack_b4 = 0;
                          local_b0 = 0;
                          local_a0._0_4_ = 0;
                          local_a0._4_4_ = 0;
                          uStack_98._0_4_ = 0;
                          uStack_98._4_4_ = 0;
                          local_90 = 0;
                          piVar31 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                          if (piVar31 != (int *)0x0) {
                            LOCK();
                            *piVar31 = *piVar31 + -1;
                            UNLOCK();
                            if (*piVar31 == 0) {
                              if (m_2.allocator == (Allocator *)0x0) {
                                if (m_2.data != (void *)0x0) {
                                  free(m_2.data);
                                }
                              }
                              else {
                                (*(m_2.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          m_2.cstep = 0;
                          m_2.data = (void *)0x0;
                          m_2.refcount._0_4_ = 0;
                          m_2.refcount._4_4_ = 0;
                          m_2.elemsize._0_4_ = 0;
                          m_2.elemsize._4_4_ = 0;
                          m_2.elempack = 0;
                          m_2.dims = 0;
                          m_2.w = 0;
                          m_2.h = 0;
                          m_2.d = 0;
                          m_2.c = 0;
                          iVar13 = iVar13 + (int)B_int8_scale;
                          fVar30 = (float)((int)fVar30 - (int)B_int8_scale);
                        } while (iVar13 < (int)fVar23);
                      }
                      unpack_output_tile_dequantize
                                (&m_1,&local_328,this_00,local_34c,iVar12,iVar27,iVar26,
                                 (int)local_338,&local_228,fVar1,(float)local_2e0,iVar15);
                      iVar26 = iVar26 + TILE_K;
                    } while (iVar26 < iVar2);
                  }
                  iVar26 = local_7c;
                  piVar31 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar31 != (int *)0x0) {
                    LOCK();
                    *piVar31 = *piVar31 + -1;
                    UNLOCK();
                    if (*piVar31 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  iVar26 = iVar26 + 1;
                } while (iVar26 != (int)local_d0);
              }
              iVar26 = 0;
            }
            piVar31 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
            if (piVar31 != (int *)0x0) {
              LOCK();
              *piVar31 = *piVar31 + -1;
              UNLOCK();
              if (*piVar31 == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  if (m.data != (void *)0x0) {
                    free(m.data);
                  }
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m.cstep = 0;
            m.data = (void *)0x0;
            m.refcount._0_4_ = 0;
            m.refcount._4_4_ = 0;
            m.elemsize._0_4_ = 0;
            m.elemsize._4_4_ = 0;
            m.elempack = 0;
            m.dims = 0;
            m.w = 0;
            m.h = 0;
            m.d = 0;
            m.c = 0;
          }
          piVar31 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar31 != (int *)0x0) {
            LOCK();
            *piVar31 = *piVar31 + -1;
            UNLOCK();
            if (*piVar31 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
        }
        piVar31 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + -1;
          UNLOCK();
          if (*piVar31 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              if (local_228.data != (void *)0x0) {
                free(local_228.data);
              }
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.dims = 0;
        local_228.w = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
      }
      piVar31 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + -1;
        UNLOCK();
        if (*piVar31 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      goto LAB_004bd28b;
    }
    iVar2 = (this->super_Gemm).transA;
    if (iVar2 == 0) {
      iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
    }
    else {
      iVar13 = A->w;
    }
    iVar21 = (this->super_Gemm).transB;
    if (iVar2 == 0) {
      iVar27 = A->w;
    }
    else {
      iVar27 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
    }
    if (iVar21 == 0) {
      iVar15 = A[1].w;
    }
    else {
      iVar15 = A[1].elempack * (&A[1].h)[(ulong)(A[1].dims == 3) * 2];
    }
    local_140 = (ulong)(uint)(this->super_Gemm).output_transpose;
    fVar1 = (this->super_Gemm).alpha;
    fVar23 = (this->super_Gemm).beta;
    local_2e0 = (ulong)uVar28;
    get_optimal_tile_mnk_int8
              (iVar13,iVar15,iVar27,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_K,
               (int *)&B_int8_scale,&TILE_K_2,uVar28);
    iVar29 = TILE_K_2;
    iVar26 = TILE_K;
    fVar30 = B_int8_scale;
    iVar12 = (iVar13 + TILE_K + -1) / TILE_K;
    iVar16 = ((int)B_int8_scale + iVar15 + -1) / (int)B_int8_scale;
    iVar25 = (iVar27 + TILE_K_2 + -1) / TILE_K_2;
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    if (TILE_K_2 < 4) {
LAB_004bb964:
      Mat::create(&local_188,iVar26 * iVar29,iVar25,(int)local_2e0,1,opt->workspace_allocator);
    }
    else {
      iVar10 = cpu_support_x86_avx512_vnni();
      bVar32 = true;
      if (iVar10 == 0) {
        iVar10 = cpu_support_x86_avx_vnni();
        bVar32 = iVar10 != 0;
      }
      iVar10 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar32 & iVar10 == 0)) goto LAB_004bb964;
      iVar10 = 0x40;
      if (((iVar26 < 0x10) && (iVar10 = 0x20, iVar26 < 8)) && (iVar10 = 0x10, iVar26 < 4)) {
        iVar10 = (uint)(1 < iVar26) * 4 + 4;
      }
      Mat::create(&local_188,(iVar10 + iVar29) * iVar26,iVar25,(int)local_2e0,1,
                  opt->workspace_allocator);
    }
    iVar26 = -100;
    if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      Mat::create(&local_228,iVar29 * (int)fVar30,iVar25,iVar16,1,opt->workspace_allocator);
      iVar26 = -100;
      if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.refcount._0_4_ = 0;
        m_3.refcount._4_4_ = 0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
        Mat::create(&m_3,iVar13,4,opt->workspace_allocator);
        iVar26 = -100;
        if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
          local_338 = A + 1;
          compute_B_int8_scale(local_338,&B_int8_scale_1);
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.allocator = (Allocator *)0x0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          Mat::create(&m,iVar13,4,opt->workspace_allocator);
          fVar5 = B_int8_scale_1;
          iVar13 = TILE_K_2;
          fVar30 = B_int8_scale;
          iVar26 = -100;
          if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
            iVar16 = iVar25 * iVar16;
            if (0 < iVar16) {
              iVar26 = 0;
              do {
                iVar29 = (int)fVar30 * (iVar26 / iVar25);
                iVar10 = iVar13 * (int)((long)iVar26 % (long)iVar25);
                max_jj = (float)(iVar15 - iVar29);
                if ((int)fVar30 < iVar15 - iVar29) {
                  max_jj = fVar30;
                }
                iVar11 = iVar27 - iVar10;
                if (iVar13 < iVar27 - iVar10) {
                  iVar11 = iVar13;
                }
                m_1.cstep = (size_t)local_228.w;
                m_1.data = (void *)((long)local_228.data +
                                   ((long)iVar26 % (long)iVar25 & 0xffffffffU) * m_1.cstep *
                                   CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize)
                                   + (long)(iVar26 / iVar25) * local_228.cstep *
                                     CONCAT44(local_228.elemsize._4_4_,
                                              (undefined4)local_228.elemsize));
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = (undefined4)local_228.elemsize;
                m_1.elemsize._4_4_ = local_228.elemsize._4_4_;
                m_1.elempack = local_228.elempack;
                m_1.allocator = local_228.allocator;
                m_1.dims = 2;
                m_1.w = local_228.w;
                m_1.h = 1;
                m_1.d = 1;
                m_1.c = 1;
                if (iVar21 == 0) {
                  transpose_pack_B_tile_quantize
                            (local_338,&m_1,iVar29,(int)max_jj,iVar10,iVar11,fVar5);
                }
                else {
                  pack_B_tile_quantize(local_338,&m_1,iVar29,(int)max_jj,iVar10,iVar11,fVar5);
                }
                iVar26 = iVar26 + 1;
              } while (iVar16 != iVar26);
            }
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.allocator = (Allocator *)0x0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
            Mat::create(&m_1,TILE_K * (int)B_int8_scale,1,(int)local_2e0,4,opt->workspace_allocator)
            ;
            iVar26 = -100;
            if ((m_1.data != (void *)0x0) && (iVar26 = -100, (long)m_1.c * m_1.cstep != 0)) {
              if (iVar12 < 1) {
                iVar26 = 0;
              }
              else {
                iVar26 = 0;
                local_338 = (Mat *)CONCAT44(local_338._4_4_,B_int8_scale);
                fVar30 = B_int8_scale;
                do {
                  if (iVar2 == 0) {
                    iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                    iVar21 = A->w;
                  }
                  else {
                    iVar13 = A->w;
                    iVar21 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                  }
                  iVar29 = iVar26 * TILE_K;
                  iVar27 = iVar13 - iVar29;
                  if (TILE_K < iVar13 - iVar29) {
                    iVar27 = TILE_K;
                  }
                  iVar13 = get_omp_thread_num();
                  uVar19 = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
                  m_2.data = (void *)((long)iVar13 * m_1.cstep * uVar19 + (long)m_1.data);
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)m_1.elemsize;
                  m_2.elemsize._4_4_ = m_1.elemsize._4_4_;
                  m_2.elempack = m_1.elempack;
                  m_2.allocator = m_1.allocator;
                  m_2.d = 1;
                  m_2.h = m_1.h;
                  m_2.c = m_1.d;
                  m_2.w = m_1.w;
                  m_2.dims = m_1.dims + -1;
                  m_2.cstep = (uVar19 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                              uVar19;
                  if (m_1.dims == 4) {
                    m_2.cstep = (long)m_1.h * (long)m_1.w;
                  }
                  if (0 < iVar15) {
                    iVar13 = 0;
                    do {
                      fVar5 = (float)(iVar15 - iVar13);
                      if ((int)fVar30 < iVar15 - iVar13) {
                        fVar5 = fVar30;
                      }
                      if (0 < iVar21) {
                        iVar25 = 0;
                        iVar16 = iVar21;
                        do {
                          iVar10 = iVar16;
                          if (TILE_K_2 < iVar16) {
                            iVar10 = TILE_K_2;
                          }
                          iVar11 = get_omp_thread_num();
                          local_88 = (size_t)local_188.w;
                          _TILE_M = (void *)((long)local_188.data +
                                            CONCAT44(local_188.elemsize._4_4_,
                                                     (undefined4)local_188.elemsize) * local_88 *
                                            (long)(iVar25 / TILE_K_2) +
                                            (long)iVar11 * local_188.cstep *
                                            CONCAT44(local_188.elemsize._4_4_,
                                                     (undefined4)local_188.elemsize));
                          local_38 = (size_t)local_228.w;
                          _TILE_N = (void *)((long)local_228.data +
                                            local_38 *
                                            CONCAT44(local_228.elemsize._4_4_,
                                                     (undefined4)local_228.elemsize) *
                                            (long)(iVar25 / TILE_K_2) +
                                            (long)(iVar13 / (int)local_338._0_4_) * local_228.cstep
                                            * CONCAT44(local_228.elemsize._4_4_,
                                                       (undefined4)local_228.elemsize));
                          uStack_c0 = 0;
                          uStack_bc = 0;
                          local_b8 = (undefined4)local_188.elemsize;
                          uStack_b4 = local_188.elemsize._4_4_;
                          local_b0 = local_188.elempack;
                          local_a8 = local_188.allocator;
                          local_a0._4_4_ = local_188.w;
                          local_a0._0_4_ = 2;
                          uStack_98._0_4_ = 1;
                          uStack_98._4_4_ = 1;
                          local_90 = 1;
                          uStack_70 = 0;
                          uStack_6c = 0;
                          local_68 = (undefined4)local_228.elemsize;
                          uStack_64 = local_228.elemsize._4_4_;
                          local_60 = local_228.elempack;
                          local_58 = local_228.allocator;
                          local_50._4_4_ = local_228.w;
                          local_50._0_4_ = 2;
                          uStack_48._0_4_ = 1;
                          uStack_48._4_4_ = 1;
                          local_40 = 1;
                          if (iVar13 == 0) {
                            if (iVar25 == 0) {
                              if (iVar2 == 0) {
                                compute_A_tile_int8_scales(A,&m_3,B_int8_scale_1,&m,iVar29,iVar27);
                              }
                              else {
                                transpose_compute_A_tile_int8_scales
                                          (A,&m_3,B_int8_scale_1,&m,iVar29,iVar27);
                              }
                            }
                            if (iVar2 == 0) {
                              pack_A_tile_quantize
                                        (A,(Mat *)&TILE_M,iVar29,iVar27,iVar25,iVar10,&m_3);
                            }
                            else {
                              transpose_pack_A_tile_quantize
                                        (A,(Mat *)&TILE_M,iVar29,iVar27,iVar25,iVar10,&m_3);
                            }
                          }
                          gemm_transB_packed_tile_int8
                                    ((Mat *)&TILE_M,(Mat *)&TILE_N,&m_2,iVar29,iVar27,iVar13,
                                     (int)fVar5,iVar25,iVar10);
                          piVar31 = (int *)CONCAT44(uStack_6c,uStack_70);
                          if (piVar31 != (int *)0x0) {
                            LOCK();
                            *piVar31 = *piVar31 + -1;
                            UNLOCK();
                            if (*piVar31 == 0) {
                              if (local_58 == (Allocator *)0x0) {
                                if (_TILE_N != (void *)0x0) {
                                  free(_TILE_N);
                                }
                              }
                              else {
                                (*local_58->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_38 = 0;
                          _TILE_N = (void *)0x0;
                          uStack_70 = 0;
                          uStack_6c = 0;
                          local_68 = 0;
                          uStack_64 = 0;
                          local_60 = 0;
                          local_50._0_4_ = 0;
                          local_50._4_4_ = 0;
                          uStack_48._0_4_ = 0;
                          uStack_48._4_4_ = 0;
                          local_40 = 0;
                          piVar31 = (int *)CONCAT44(uStack_bc,uStack_c0);
                          if (piVar31 != (int *)0x0) {
                            LOCK();
                            *piVar31 = *piVar31 + -1;
                            UNLOCK();
                            if (*piVar31 == 0) {
                              if (local_a8 == (Allocator *)0x0) {
                                if (_TILE_M != (void *)0x0) {
                                  free(_TILE_M);
                                }
                              }
                              else {
                                (*local_a8->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_88 = 0;
                          _TILE_M = (void *)0x0;
                          uStack_c0 = 0;
                          uStack_bc = 0;
                          local_b8 = 0;
                          uStack_b4 = 0;
                          local_b0 = 0;
                          local_a0._0_4_ = 0;
                          local_a0._4_4_ = 0;
                          uStack_98._0_4_ = 0;
                          uStack_98._4_4_ = 0;
                          local_90 = 0;
                          iVar25 = iVar25 + TILE_K_2;
                          iVar16 = iVar16 - TILE_K_2;
                        } while (iVar25 < iVar21);
                      }
                      unpack_output_tile_dequantize
                                (&m_2,&local_328,this_00,local_34c,iVar29,iVar27,iVar13,(int)fVar5,
                                 &m,fVar1,fVar23,(int)local_140);
                      iVar13 = iVar13 + (int)local_338._0_4_;
                      fVar30 = local_338._0_4_;
                    } while (iVar13 < iVar15);
                  }
                  piVar31 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                  if (piVar31 != (int *)0x0) {
                    LOCK();
                    *piVar31 = *piVar31 + -1;
                    UNLOCK();
                    if (*piVar31 == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        if (m_2.data != (void *)0x0) {
                          free(m_2.data);
                        }
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  iVar26 = iVar26 + 1;
                } while (iVar26 != iVar12);
                iVar26 = 0;
              }
            }
            piVar31 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
            if (piVar31 != (int *)0x0) {
              LOCK();
              *piVar31 = *piVar31 + -1;
              UNLOCK();
              if (*piVar31 == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  if (m_1.data != (void *)0x0) {
                    free(m_1.data);
                  }
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_1.cstep = 0;
            m_1.data = (void *)0x0;
            m_1.refcount._0_4_ = 0;
            m_1.refcount._4_4_ = 0;
            m_1.elemsize._0_4_ = 0;
            m_1.elemsize._4_4_ = 0;
            m_1.elempack = 0;
            m_1.dims = 0;
            m_1.w = 0;
            m_1.h = 0;
            m_1.d = 0;
            m_1.c = 0;
          }
          piVar31 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar31 != (int *)0x0) {
            LOCK();
            *piVar31 = *piVar31 + -1;
            UNLOCK();
            if (*piVar31 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
        }
        piVar31 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
        if (piVar31 != (int *)0x0) {
          LOCK();
          *piVar31 = *piVar31 + -1;
          UNLOCK();
          if (*piVar31 == 0) {
            if (m_3.allocator == (Allocator *)0x0) {
              if (m_3.data != (void *)0x0) {
                free(m_3.data);
              }
            }
            else {
              (*(m_3.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.refcount._0_4_ = 0;
        m_3.refcount._4_4_ = 0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      piVar31 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + -1;
        UNLOCK();
        if (*piVar31 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            if (local_228.data != (void *)0x0) {
              free(local_228.data);
            }
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
    }
    piVar31 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar31 != (int *)0x0) {
      LOCK();
      *piVar31 = *piVar31 + -1;
      UNLOCK();
      if (*piVar31 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
joined_r0x004bc3ca:
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    fVar1 = (this->super_Gemm).B_data_int8_scale;
    uVar22 = (this->super_Gemm).constantM;
    uVar20 = (ulong)uVar22;
    iVar26 = (this->super_Gemm).constantN;
    iVar2 = (this->super_Gemm).constantK;
    iVar13 = (this->super_Gemm).output_transpose;
    fVar23 = (this->super_Gemm).alpha;
    fVar30 = (this->super_Gemm).beta;
    local_140 = CONCAT44(local_140._4_4_,iVar26);
    get_optimal_tile_mnk_int8
              (uVar22,iVar26,iVar2,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,(int *)&m_2,
               &TILE_M,&TILE_N,uVar28);
    iVar21 = (int)m_2.data;
    uVar19 = (long)(int)((int)m_2.data + uVar22 + -1) / (long)(int)m_2.data;
    local_188.cstep = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.elemsize._0_4_ = 0;
    local_188.elemsize._4_4_ = 0;
    local_188.elempack = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.d = 0;
    local_188.c = 0;
    Mat::create(&local_188,uVar22,4,opt->workspace_allocator);
    iVar26 = -100;
    local_2e0 = uVar20;
    if ((local_188.data != (void *)0x0) && ((long)local_188.c * local_188.cstep != 0)) {
      if (0 < (int)uVar22) {
        pvVar4 = (this->super_Gemm).A_data_int8_scales.data;
        uVar18 = 0;
        do {
          *(float *)((long)local_188.data + uVar18 * 4) =
               1.0 / (*(float *)((long)pvVar4 + uVar18 * 4) * fVar1);
          uVar18 = uVar18 + 1;
        } while (uVar20 != uVar18);
      }
      iVar27 = TILE_M;
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      Mat::create(&local_228,TILE_M * iVar21,1,uVar28,4,opt->workspace_allocator);
      iVar26 = -100;
      if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
        if ((int)uVar19 < 1) {
          iVar26 = 0;
        }
        else {
          iVar26 = TILE_N;
          uVar18 = 0;
          uVar20 = local_2e0;
          iVar15 = (int)(float)local_140;
          local_d0 = uVar19 & 0xffffffff;
          do {
            iVar29 = iVar21 * (int)uVar18;
            local_338 = (Mat *)CONCAT44(local_338._4_4_,iVar29);
            iVar29 = (int)uVar20 - iVar29;
            if (iVar21 < iVar29) {
              iVar29 = iVar21;
            }
            iVar12 = get_omp_thread_num();
            uVar19 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
            m_3.data = (void *)((long)iVar12 * local_228.cstep * uVar19 + (long)local_228.data);
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_228.elemsize;
            m_3.elemsize._4_4_ = local_228.elemsize._4_4_;
            m_3.elempack = local_228.elempack;
            m_3.allocator = local_228.allocator;
            m_3.w = local_228.w;
            m_3.h = local_228.h;
            m_3.d = 1;
            m_3.c = local_228.d;
            m_3.dims = local_228.dims + -1;
            m_3.cstep = (uVar19 * (long)local_228.h * (long)local_228.w + 0xf & 0xfffffffffffffff0)
                        / uVar19;
            if (local_228.dims == 4) {
              m_3.cstep = (long)local_228.h * (long)local_228.w;
            }
            if (0 < iVar15) {
              iVar12 = 0;
              do {
                iVar16 = iVar15 - iVar12;
                if (iVar27 < iVar15 - iVar12) {
                  iVar16 = iVar27;
                }
                if (0 < iVar2) {
                  iVar25 = 0;
                  iVar15 = iVar2;
                  do {
                    iVar10 = iVar15;
                    if (iVar26 < iVar15) {
                      iVar10 = iVar26;
                    }
                    m.w = (this->AT_data).w;
                    m.cstep = (size_t)m.w;
                    sVar17 = (this->AT_data).elemsize;
                    m.elempack = (this->AT_data).elempack;
                    m.allocator = (this->AT_data).allocator;
                    m.data = (void *)((long)(this->AT_data).data +
                                     sVar17 * m.cstep * (long)(iVar25 / iVar26) +
                                     (this->AT_data).cstep * uVar18 * sVar17);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar17;
                    m.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
                    m.dims = 2;
                    m.h = 1;
                    m.d = 1;
                    m.c = 1;
                    m_1.w = (this->BT_data).w;
                    m_1.cstep = (size_t)m_1.w;
                    sVar17 = (this->BT_data).elemsize;
                    m_1.elempack = (this->BT_data).elempack;
                    m_1.data = (void *)((long)(this->BT_data).data +
                                       m_1.cstep * sVar17 * (long)(iVar25 / iVar26) +
                                       (this->BT_data).cstep * (long)(iVar12 / iVar27) * sVar17);
                    m_1.allocator = (this->BT_data).allocator;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)sVar17;
                    m_1.elemsize._4_4_ = (undefined4)(sVar17 >> 0x20);
                    m_1.dims = 2;
                    m_1.h = 1;
                    m_1.d = 1;
                    m_1.c = 1;
                    gemm_transB_packed_tile_int8
                              (&m,&m_1,&m_3,(int)local_338._0_4_,iVar29,iVar12,iVar16,iVar25,iVar10)
                    ;
                    piVar31 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar31 != (int *)0x0) {
                      LOCK();
                      *piVar31 = *piVar31 + -1;
                      UNLOCK();
                      if (*piVar31 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                    piVar31 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar31 != (int *)0x0) {
                      LOCK();
                      *piVar31 = *piVar31 + -1;
                      UNLOCK();
                      if (*piVar31 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = 0;
                    m.elemsize._4_4_ = 0;
                    m.elempack = 0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    iVar25 = iVar25 + iVar26;
                    iVar15 = iVar15 - iVar26;
                  } while (iVar25 < iVar2);
                }
                unpack_output_tile_dequantize
                          (&m_3,&local_328,this_00,local_34c,(int)local_338._0_4_,iVar29,iVar12,
                           iVar16,&local_188,fVar23,fVar30,iVar13);
                iVar12 = iVar12 + iVar27;
                iVar15 = (int)(float)local_140;
              } while (iVar12 < (int)(float)local_140);
            }
            uVar20 = local_2e0;
            piVar31 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar31 != (int *)0x0) {
              LOCK();
              *piVar31 = *piVar31 + -1;
              UNLOCK();
              if (*piVar31 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_d0);
          iVar26 = 0;
        }
      }
      piVar31 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + -1;
        UNLOCK();
        if (*piVar31 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            if (local_228.data != (void *)0x0) {
              free(local_228.data);
            }
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
    }
    piVar31 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar31 != (int *)0x0) {
      LOCK();
      *piVar31 = *piVar31 + -1;
      UNLOCK();
      if (*piVar31 == 0) {
        if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004bc3ca;
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize._0_4_ = 0;
  local_188.elemsize._4_4_ = 0;
  local_188.elempack = 0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
LAB_004bd28b:
  piVar31 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
  if (piVar31 != (int *)0x0) {
    LOCK();
    *piVar31 = *piVar31 + -1;
    UNLOCK();
    if (*piVar31 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        if (local_328.data != (void *)0x0) {
          free(local_328.data);
        }
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int Gemm_x86::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}